

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O1

QRectF * __thiscall QGraphicsScene::sceneRect(QRectF *__return_storage_ptr__,QGraphicsScene *this)

{
  undefined4 *puVar1;
  QRectF *r2;
  long lVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  bool bVar10;
  QGraphicsScenePrivate *thatd;
  long lVar11;
  long in_FS_OFFSET;
  QRectF QStack_98;
  QRectF local_78;
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)(this + 8);
  lVar11 = 0x98;
  if (((*(uint *)(lVar2 + 0xb8) & 1) == 0) && (lVar11 = 200, (*(uint *)(lVar2 + 0xb8) & 2) != 0)) {
    r2 = (QRectF *)(lVar2 + 200);
    local_78.xp = *(qreal *)(lVar2 + 200);
    local_78.yp = *(qreal *)(lVar2 + 0xd0);
    local_78.w = *(qreal *)(lVar2 + 0xd8);
    local_78.h = *(qreal *)(lVar2 + 0xe0);
    itemsBoundingRect(&QStack_98,this);
    QRectF::operator|(&local_58,r2);
    *(qreal *)(lVar2 + 0xd8) = local_58.w;
    *(qreal *)(lVar2 + 0xe0) = local_58.h;
    *(qreal *)(lVar2 + 200) = local_58.xp;
    *(qreal *)(lVar2 + 0xd0) = local_58.yp;
    *(byte *)(lVar2 + 0xb8) = *(byte *)(lVar2 + 0xb8) & 0xfd;
    bVar10 = comparesEqual(&local_78,r2);
    if (!bVar10) {
      local_58.xp = 0.0;
      local_58.yp = (qreal)r2;
      QMetaObject::activate((QObject *)this,&staticMetaObject,1,(void **)&local_58);
    }
  }
  puVar1 = (undefined4 *)(lVar2 + lVar11);
  uVar3 = *puVar1;
  uVar4 = puVar1[1];
  uVar5 = puVar1[2];
  uVar6 = puVar1[3];
  puVar1 = (undefined4 *)(lVar2 + 0x10 + lVar11);
  uVar7 = puVar1[1];
  uVar8 = puVar1[2];
  uVar9 = puVar1[3];
  *(undefined4 *)&__return_storage_ptr__->w = *puVar1;
  *(undefined4 *)((long)&__return_storage_ptr__->w + 4) = uVar7;
  *(undefined4 *)&__return_storage_ptr__->h = uVar8;
  *(undefined4 *)((long)&__return_storage_ptr__->h + 4) = uVar9;
  *(undefined4 *)&__return_storage_ptr__->xp = uVar3;
  *(undefined4 *)((long)&__return_storage_ptr__->xp + 4) = uVar4;
  *(undefined4 *)&__return_storage_ptr__->yp = uVar5;
  *(undefined4 *)((long)&__return_storage_ptr__->yp + 4) = uVar6;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QRectF QGraphicsScene::sceneRect() const
{
    Q_D(const QGraphicsScene);
    if (d->hasSceneRect)
        return d->sceneRect;

    if (d->dirtyGrowingItemsBoundingRect) {
        // Lazily update the growing items bounding rect
        QGraphicsScenePrivate *thatd = const_cast<QGraphicsScenePrivate *>(d);
        QRectF oldGrowingBoundingRect = thatd->growingItemsBoundingRect;
        thatd->growingItemsBoundingRect |= itemsBoundingRect();
        thatd->dirtyGrowingItemsBoundingRect = false;
        if (oldGrowingBoundingRect != thatd->growingItemsBoundingRect)
            emit const_cast<QGraphicsScene *>(this)->sceneRectChanged(thatd->growingItemsBoundingRect);
    }
    return d->growingItemsBoundingRect;
}